

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
print_fileinfo::perform(print_fileinfo *this,filesystemcollection *fslist,readercollection *rdlist)

{
  bool bVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  undefined1 local_30 [8];
  FileContainer_ptr fs;
  readercollection *rdlist_local;
  filesystemcollection *fslist_local;
  print_fileinfo *this_local;
  
  fs.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rdlist;
  filesystemcollection::getbyname((filesystemcollection *)local_30,(string *)fslist);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (!bVar1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "dump: invalid fsname";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  peVar3 = std::__shared_ptr_access<FileContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FileContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  (*peVar3->_vptr_FileContainer[6])(peVar3,&this->_romname);
  std::shared_ptr<FileContainer>::~shared_ptr((shared_ptr<FileContainer> *)local_30);
  return;
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        FileContainer_ptr fs= fslist.getbyname(_fsname);
        if (!fs) throw "dump: invalid fsname";

        fs->printfileinfo(_romname);
    }